

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  LocationRecorder location;
  undefined1 local_50 [32];
  
  ConsumeEndOfDeclaration(this,"{",parent_location);
  bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
  if (!bVar2) {
    do {
      if ((this->input_->current_).type == TYPE_END) {
        local_50._0_8_ = (Parser *)(local_50 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Reached end of input in method options (missing \'}\').","");
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column);
        }
        this->had_errors_ = true;
        if ((Parser *)local_50._0_8_ != (Parser *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        return false;
      }
      bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
      if (!bVar2) {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_50,parent_location,optionsFieldNumber);
        bVar2 = ParseOption(this,mutable_options,(LocationRecorder *)local_50,containing_file,
                            OPTION_STATEMENT);
        if (!bVar2) {
          SkipStatement(this);
        }
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_50);
      }
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location, optionsFieldNumber);
      if (!ParseOption(mutable_options, location, containing_file,
                       OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}